

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O2

Location *
psy::Location::create(Location *__return_storage_ptr__,FileLinePositionSpan *fileLineSpan)

{
  FileLinePositionSpan local_40;
  
  FileLinePositionSpan::FileLinePositionSpan(&local_40,fileLineSpan);
  Location(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Location Location::create(FileLinePositionSpan fileLineSpan)
{
    return Location(std::move(fileLineSpan));
}